

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManCutMatchPrint(Nf_Man_t *p,int iObj,char *pStr,Nf_Mat_t *pM)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  undefined8 *puVar10;
  
  printf("%5d %s : ");
  uVar5 = *(uint *)pM;
  if ((uVar5 & 0x3ff00000) == 0) {
    puts("Unassigned");
    return;
  }
  if ((-1 < iObj) && (iObj < (p->vCutSets).nSize)) {
    uVar1 = (p->vCutSets).pArray[(uint)iObj];
    uVar3 = (int)uVar1 >> 0x10;
    if ((-1 < (int)uVar3) && ((int)uVar3 < (p->vPages).nSize)) {
      uVar4 = uVar5 >> 0x14 & 0x3ff;
      if (uVar4 != 0) {
        puVar10 = (undefined8 *)
                  ((long)p->pCells->iDelays + ((ulong)((uVar5 & 0xfffff) * 0x50) - 0x2c));
        pvVar2 = (p->vPages).pArray[uVar3];
        printf("D =%6.2f  ",(double)((float)pM->D / 1000.0));
        printf("A =%6.2f  ",(double)pM->F);
        uVar9 = 0;
        printf("C = %d ",(ulong)(*(uint *)pM >> 0x1e & 1));
        printf("  ");
        printf("Cut = {");
        if (0xfffffff < *(uint *)(puVar10 + 2)) {
          uVar9 = 0;
          do {
            printf("%4d ",(ulong)*(uint *)((long)pvVar2 +
                                          uVar9 * 4 +
                                          (ulong)uVar4 * 4 + (ulong)(uVar1 & 0xffff) * 4 + 4));
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)(puVar10 + 2) >> 0x1c);
        }
        if ((uint)uVar9 < 6) {
          iVar8 = (uint)uVar9 - 6;
          do {
            printf("     ");
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
        }
        uVar9 = 0;
        printf("}  ");
        printf("%10s ",*puVar10);
        printf("%d  ",(ulong)(*(uint *)(puVar10 + 2) >> 0x1c));
        putchar(0x7b);
        if (0xfffffff < *(uint *)(puVar10 + 2)) {
          uVar9 = 0;
          do {
            printf("%6.2f ",(double)((float)*(int *)((long)puVar10 + uVar9 * 4 + 0x2c) / 1000.0));
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)(puVar10 + 2) >> 0x1c);
        }
        if ((uint)uVar9 < 6) {
          iVar8 = (uint)uVar9 - 6;
          do {
            printf("       ");
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
        }
        uVar5 = 0;
        printf(" } ");
        if (0xfffffff < *(uint *)(puVar10 + 2)) {
          bVar7 = 0;
          uVar5 = 0;
          do {
            pcVar6 = "!";
            if ((1 << ((byte)uVar5 & 0x1f) & (uint)pM->Cfg >> 1 & 0x7f) == 0) {
              pcVar6 = " ";
            }
            printf("%s%d ",pcVar6,(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf));
            uVar5 = uVar5 + 1;
            bVar7 = bVar7 + 4;
          } while (uVar5 < *(uint *)(puVar10 + 2) >> 0x1c);
        }
        if (uVar5 < 6) {
          iVar8 = uVar5 - 6;
          do {
            printf("  ");
            iVar8 = iVar8 + 1;
          } while (iVar8 != 0);
        }
        Dau_DsdPrintFromTruth(puVar10 + 4,*(uint *)(puVar10 + 2) >> 0x1c);
        return;
      }
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x94,"int *Nf_CutFromHandle(int *, int)");
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Nf_ManCutMatchPrint( Nf_Man_t * p, int iObj, char * pStr, Nf_Mat_t * pM )
{
    Mio_Cell2_t * pCell;
    int i, * pCut;
    printf( "%5d %s : ", iObj, pStr );
    if ( pM->CutH == 0 )
    {
        printf( "Unassigned\n" );
        return;
    }
    pCell = Nf_ManCell( p, pM->Gate );
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    printf( "D =%6.2f  ", Scl_Int2Flt(pM->D) );
    printf( "A =%6.2f  ", pM->F );
    printf( "C = %d ", pM->fCompl );
//    printf( "B = %d ", pM->fBest );
    printf( "  " );
    printf( "Cut = {" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%4d ", Nf_CutLeaves(pCut)[i] );
    for ( ; i < 6; i++ )
        printf( "     " );
    printf( "}  " );
    printf( "%10s ", pCell->pName );
    printf( "%d  ", pCell->nFanins );
    printf( "{" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%6.2f ", Scl_Int2Flt(pCell->iDelays[i]) );
    for ( ; i < 6; i++ )
        printf( "       " );
    printf( " } " );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%s%d ", Nf_CfgCompl(pM->Cfg, i) ? "!":" ", Nf_CfgVar(pM->Cfg, i) );
    for ( ; i < 6; i++ )
        printf( "  " );
    Dau_DsdPrintFromTruth( &pCell->uTruth, pCell->nFanins );
}